

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O3

int raplcap_msr_pd_is_zone_locked(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  int iVar1;
  int iVar2;
  raplcap_msr *ctx;
  int *piVar3;
  uint64_t msrval;
  uint64_t local_30;
  
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    iVar2 = -1;
    if (-1 < ZONE_OFFSETS_PL[zone] && ctx != (raplcap_msr *)0x0) {
      iVar1 = msr_sys_read(ctx->sys,&local_30,pkg,die,ZONE_OFFSETS_PL[zone]);
      if (iVar1 == 0) {
        iVar2 = msr_is_zone_locked(&ctx->ctx,zone,local_30);
      }
    }
  }
  else {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int raplcap_msr_pd_is_zone_locked(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  uint64_t msrval;
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_PL);
  raplcap_log(DEBUG, "raplcap_msr_pd_is_zone_locked: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0 || msr_sys_read(state->sys, &msrval, pkg, die, msr)) {
    return -1;
  }
  return msr_is_zone_locked(&state->ctx, zone, msrval);
}